

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  bool bVar1;
  int iVar2;
  Descriptor *type;
  Message *pMVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  long lVar5;
  bool bVar6;
  char *pcVar7;
  ErrorPrinter error_collector;
  Parser parser;
  DynamicMessageFactory dynamic_factory;
  FileOutputStream out;
  FileInputStream in;
  MultiFileErrorCollector local_138;
  ErrorCollector local_130;
  ErrorFormat local_128;
  undefined4 uStack_124;
  undefined8 local_120;
  Parser local_118;
  DynamicMessageFactory local_f8;
  FileOutputStream local_d0;
  FileInputStream local_80;
  MessageLite *this_00;
  
  type = DescriptorPool::FindMessageTypeByName(pool,&this->codec_type_);
  if (type == (Descriptor *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Type not defined: ",0x12);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->codec_type_)._M_dataplus._M_p,
                        (this->codec_type_)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return false;
  }
  DynamicMessageFactory::DynamicMessageFactory(&local_f8,pool);
  pMVar3 = DynamicMessageFactory::GetPrototype(&local_f8,type);
  iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
  this_00 = (MessageLite *)CONCAT44(extraout_var,iVar2);
  io::FileInputStream::FileInputStream(&local_80,0,-1);
  io::FileOutputStream::FileOutputStream(&local_d0,1,-1);
  if (this->mode_ == MODE_ENCODE) {
    local_128 = this->error_format_;
    local_138._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_0028dda0;
    local_130._vptr_ErrorCollector = (_func_int **)&DAT_0028ddd0;
    local_120 = 0;
    TextFormat::Parser::Parser(&local_118);
    local_118.allow_partial_ = true;
    local_118.error_collector_ = &local_130;
    bVar1 = TextFormat::Parser::Parse
                      (&local_118,&local_80.super_ZeroCopyInputStream,(Message *)this_00);
    if (bVar1) {
      TextFormat::Parser::~Parser(&local_118);
      io::ErrorCollector::~ErrorCollector(&local_130);
      MultiFileErrorCollector::~MultiFileErrorCollector(&local_138);
      if (this_00 == (MessageLite *)0x0) goto LAB_00181812;
LAB_00181661:
      iVar2 = (*this_00->_vptr_MessageLite[5])(this_00);
      if ((char)iVar2 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"warning:  Input message is missing required fields:  ",
                   0x35);
        (*this_00->_vptr_MessageLite[6])(&local_138,this_00);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_138._vptr_MultiFileErrorCollector,
                            (long)local_130._vptr_ErrorCollector);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if (local_138._vptr_MultiFileErrorCollector != (_func_int **)&local_128) {
          operator_delete(local_138._vptr_MultiFileErrorCollector,CONCAT44(uStack_124,local_128) + 1
                         );
        }
      }
      if (this->mode_ == MODE_ENCODE) {
        bVar1 = MessageLite::SerializePartialToZeroCopyStream
                          (this_00,&local_d0.super_ZeroCopyOutputStream);
      }
      else {
        bVar1 = TextFormat::Print((Message *)this_00,&local_d0.super_ZeroCopyOutputStream);
      }
      bVar6 = true;
      if (bVar1 != false) goto LAB_001817d1;
      lVar5 = 0x12;
      pcVar7 = "output: I/O error.";
      goto LAB_00181795;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to parse input.",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    TextFormat::Parser::~Parser(&local_118);
    io::ErrorCollector::~ErrorCollector(&local_130);
    MultiFileErrorCollector::~MultiFileErrorCollector(&local_138);
  }
  else {
    if (this_00 == (MessageLite *)0x0) {
LAB_00181812:
      __assert_fail("ptr_ != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                    ,0x1e2,
                    "C *google::protobuf::internal::scoped_ptr<google::protobuf::Message>::operator->() const [C = google::protobuf::Message]"
                   );
    }
    bVar1 = MessageLite::ParsePartialFromZeroCopyStream(this_00,&local_80.super_ZeroCopyInputStream)
    ;
    if (bVar1) goto LAB_00181661;
    lVar5 = 0x16;
    pcVar7 = "Failed to parse input.";
LAB_00181795:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar5);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  bVar6 = false;
LAB_001817d1:
  io::FileOutputStream::~FileOutputStream(&local_d0);
  io::FileInputStream::~FileInputStream(&local_80);
  if (this_00 != (MessageLite *)0x0) {
    (*this_00->_vptr_MessageLite[1])(this_00);
  }
  DynamicMessageFactory::~DynamicMessageFactory(&local_f8);
  return bVar6;
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == NULL) {
    cerr << "Type not defined: " << codec_type_ << endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  scoped_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      cerr << "Failed to parse input." << endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    cerr << "warning:  Input message is missing required fields:  "
         << message->InitializationErrorString() << endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    if (!message->SerializePartialToZeroCopyStream(&out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      cerr << "output: I/O error." << endl;
      return false;
    }
  }

  return true;
}